

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O1

VRDatumString * __thiscall MinVR::VRDatumPtr::stringVal(VRDatumPtr *this)

{
  VRError *this_00;
  int local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->pData->type == VRCORETYPE_STRING) {
    return (VRDatumString *)this->pData;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"This datum is not a VRString.","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatum.h",
             "");
  local_b4 = 0x272;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"VRDatumString *MinVR::VRDatumPtr::stringVal()","");
  VRError::VRError(this_00,&local_50,&local_70,&local_90,&local_b4,&local_b0);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumString* stringVal()
  {
    if (pData->getType() == VRCORETYPE_STRING) {
      return static_cast<VRDatumString*>(pData);
    } else {
      VRERRORNOADV("This datum is not a VRString.");
    }
  }